

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::Duration::_InternalParse(Duration *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  void *pvVar2;
  bool bVar3;
  char cVar4;
  uint32 uVar5;
  UnknownFieldSet *unknown;
  byte *p;
  uint res;
  pair<const_char_*,_unsigned_int> pVar6;
  pair<const_char_*,_unsigned_long> pVar7;
  pair<const_char_*,_unsigned_long> pVar8;
  byte *local_38;
  char *ptr_local;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  local_38 = (byte *)ptr;
  do {
    bVar3 = internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    if (bVar3) {
      return (char *)local_38;
    }
    bVar1 = *local_38;
    res = (uint)bVar1;
    p = local_38 + 1;
    if ((char)bVar1 < '\0') {
      res = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
      if ((char)*p < '\0') {
        pVar6 = internal::ReadTagFallback((char *)local_38,res);
        p = (byte *)pVar6.first;
        res = pVar6.second;
      }
      else {
        p = local_38 + 2;
      }
    }
    local_38 = p;
    if (p == (byte *)0x0) {
      cVar4 = '\x04';
    }
    else {
      if (res >> 3 == 2) {
        if ((char)res != '\x10') goto LAB_002b880d;
        bVar1 = *p;
        pVar8.second = (long)(char)bVar1;
        pVar8.first = (char *)p;
        local_38 = p + 1;
        if ((long)(char)bVar1 < 0) {
          uVar5 = ((uint)*local_38 * 0x80 + (uint)bVar1) - 0x80;
          if ((char)*local_38 < '\0') {
            local_38 = p;
            pVar8 = internal::VarintParseSlow64((char *)p,uVar5);
          }
          else {
            pVar8.second._0_4_ = uVar5;
            pVar8.first = (char *)(p + 2);
            pVar8.second._4_4_ = 0;
          }
          local_38 = (byte *)pVar8.first;
        }
        this->nanos_ = (int32)pVar8.second;
      }
      else {
        if ((res >> 3 != 1) || ((char)res != '\b')) {
LAB_002b880d:
          if (res == 0 || (res & 7) == 4) {
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
            cVar4 = '\a';
          }
          else {
            pvVar2 = this_00->ptr_;
            if (((ulong)pvVar2 & 1) == 0) {
              unknown = internal::InternalMetadata::
                        mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
            }
            else {
              unknown = (UnknownFieldSet *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 8);
            }
            local_38 = (byte *)internal::UnknownFieldParse((ulong)res,unknown,(char *)local_38,ctx);
            cVar4 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
          }
          goto LAB_002b889e;
        }
        bVar1 = *p;
        pVar7.second = (long)(char)bVar1;
        pVar7.first = (char *)p;
        local_38 = p + 1;
        if ((long)(char)bVar1 < 0) {
          uVar5 = ((uint)*local_38 * 0x80 + (uint)bVar1) - 0x80;
          if ((char)*local_38 < '\0') {
            local_38 = p;
            pVar7 = internal::VarintParseSlow64((char *)p,uVar5);
          }
          else {
            pVar7.second._0_4_ = uVar5;
            pVar7.first = (char *)(p + 2);
            pVar7.second._4_4_ = 0;
          }
          local_38 = (byte *)pVar7.first;
        }
        this->seconds_ = pVar7.second;
      }
      cVar4 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
    }
LAB_002b889e:
    if (cVar4 != '\x02') {
      if (cVar4 == '\x04') {
        local_38 = (byte *)0x0;
      }
      return (char *)local_38;
    }
  } while( true );
}

Assistant:

const char* Duration::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // int64 seconds = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          seconds_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // int32 nanos = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          nanos_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}